

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeStructRMW<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,AtomicRMWOp op)

{
  __index_type *__return_storage_ptr___00;
  MemoryOrder MVar1;
  Index field_00;
  MemoryOrder *pMVar2;
  Err *pEVar3;
  HeapTypeT *pHVar4;
  HeapType type_00;
  uint *puVar5;
  undefined4 in_register_00000084;
  undefined8 uVar6;
  bool bVar7;
  HeapTypeT type_01;
  Err local_288;
  Err *local_268;
  Err *err_3;
  Result<unsigned_int> _val_3;
  undefined1 local_220 [8];
  Result<unsigned_int> field;
  Err *err_2;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> _val_2;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> type;
  string local_178;
  Err local_158;
  Err local_138;
  Err *local_118;
  Err *err_1;
  Result<wasm::MemoryOrder> _val_1;
  Result<wasm::MemoryOrder> order2;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  Result<wasm::MemoryOrder> _val;
  Result<wasm::MemoryOrder> order1;
  AtomicRMWOp op_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  uVar6 = CONCAT44(in_register_00000084,op);
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
               super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20);
  memorder<wasm::WATParser::ParseDefsCtx>
            ((Result<wasm::MemoryOrder> *)__return_storage_ptr___00,ctx);
  Result<wasm::MemoryOrder>::Result
            ((Result<wasm::MemoryOrder> *)local_80,
             (Result<wasm::MemoryOrder> *)__return_storage_ptr___00);
  local_98 = Result<wasm::MemoryOrder>::getErr((Result<wasm::MemoryOrder> *)local_80);
  bVar7 = local_98 == (Err *)0x0;
  if (!bVar7) {
    wasm::Err::Err(&local_b8,local_98);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
    wasm::Err::~Err(&local_b8);
  }
  Result<wasm::MemoryOrder>::~Result((Result<wasm::MemoryOrder> *)local_80);
  if (bVar7) {
    memorder<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::MemoryOrder> *)
               ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),ctx);
    Result<wasm::MemoryOrder>::Result
              ((Result<wasm::MemoryOrder> *)&err_1,
               (Result<wasm::MemoryOrder> *)
               ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
    local_118 = Result<wasm::MemoryOrder>::getErr((Result<wasm::MemoryOrder> *)&err_1);
    bVar7 = local_118 == (Err *)0x0;
    if (!bVar7) {
      wasm::Err::Err(&local_138,local_118);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_138);
      wasm::Err::~Err(&local_138);
    }
    Result<wasm::MemoryOrder>::~Result((Result<wasm::MemoryOrder> *)&err_1);
    if (bVar7) {
      pMVar2 = Result<wasm::MemoryOrder>::operator*
                         ((Result<wasm::MemoryOrder> *)
                          ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      MVar1 = *pMVar2;
      pMVar2 = Result<wasm::MemoryOrder>::operator*
                         ((Result<wasm::MemoryOrder> *)
                          ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      if (MVar1 == *pMVar2) {
        typeidx<wasm::WATParser::ParseDefsCtx>
                  ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                    *)((long)&_val_2.val.
                              super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                      + 0x20),ctx);
        Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::Result
                  ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                    *)&err_2,
                   (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                    *)((long)&_val_2.val.
                              super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                      + 0x20));
        pEVar3 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::
                 getErr((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                         *)&err_2);
        if (pEVar3 != (Err *)0x0) {
          wasm::Err::Err((Err *)((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                        super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                        super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
                         pEVar3);
          Result<wasm::Ok>::Result
                    (__return_storage_ptr__,
                     (Err *)((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                    super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                    super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                    super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
          wasm::Err::~Err((Err *)((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
        }
        Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::~Result
                  ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                    *)&err_2);
        if (pEVar3 == (Err *)0x0) {
          pHVar4 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                   ::operator*((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                                *)((long)&_val_2.val.
                                          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                  + 0x20));
          _val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = (pHVar4->type).id;
          type_01.type.id = *(ulong *)&pHVar4->exactness & 0xffffffff;
          type_01._8_8_ = uVar6;
          fieldidx<wasm::WATParser::ParseDefsCtx>
                    ((Result<unsigned_int> *)local_220,(WATParser *)ctx,
                     (ParseDefsCtx *)
                     _val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_,type_01);
          Result<unsigned_int>::Result
                    ((Result<unsigned_int> *)&err_3,(Result<unsigned_int> *)local_220);
          local_268 = Result<unsigned_int>::getErr((Result<unsigned_int> *)&err_3);
          bVar7 = local_268 == (Err *)0x0;
          if (!bVar7) {
            wasm::Err::Err(&local_288,local_268);
            Result<wasm::Ok>::Result(__return_storage_ptr__,&local_288);
            wasm::Err::~Err(&local_288);
          }
          Result<unsigned_int>::~Result((Result<unsigned_int> *)&err_3);
          if (bVar7) {
            pHVar4 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                     ::operator*((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                                  *)((long)&_val_2.val.
                                            super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                            .
                                            super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                            .
                                            super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                            .
                                            super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                            .
                                            super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                    + 0x20));
            type_00 = TypeParserCtx::HeapTypeT::operator_cast_to_HeapType((HeapTypeT *)pHVar4);
            puVar5 = Result<unsigned_int>::operator*((Result<unsigned_int> *)local_220);
            field_00 = *puVar5;
            pMVar2 = Result<wasm::MemoryOrder>::operator*
                               ((Result<wasm::MemoryOrder> *)
                                ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                        super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20)
                               );
            ParseDefsCtx::makeStructRMW
                      (__return_storage_ptr__,ctx,pos,annotations,op,type_00,field_00,*pMVar2);
          }
          Result<unsigned_int>::~Result((Result<unsigned_int> *)local_220);
        }
        Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::~Result
                  ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                    *)((long)&_val_2.val.
                              super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                      + 0x20));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"struct.atomic.rmw memory orders must be identical",
                   (allocator<char> *)
                   ((long)&type.val.
                           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                   + 0x27));
        Lexer::err(&local_158,&ctx->in,(ulong)pos,&local_178);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_158);
        wasm::Err::~Err(&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&type.val.
                           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                   + 0x27));
      }
    }
    Result<wasm::MemoryOrder>::~Result
              ((Result<wasm::MemoryOrder> *)
               ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
  }
  Result<wasm::MemoryOrder>::~Result
            ((Result<wasm::MemoryOrder> *)
             ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                     super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeStructRMW(Ctx& ctx,
                       Index pos,
                       const std::vector<Annotation>& annotations,
                       AtomicRMWOp op) {
  auto order1 = memorder(ctx);
  CHECK_ERR(order1);
  auto order2 = memorder(ctx);
  CHECK_ERR(order2);
  if (*order1 != *order2) {
    return ctx.in.err(pos, "struct.atomic.rmw memory orders must be identical");
  }
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  auto field = fieldidx(ctx, *type);
  CHECK_ERR(field);
  return ctx.makeStructRMW(pos, annotations, op, *type, *field, *order1);
}